

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItemPrivate::resolveDepth(QGraphicsItemPrivate *this)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItemPrivate *in_RDI;
  
  if (in_RDI->parent == (QGraphicsItem *)0x0) {
    in_RDI->itemDepth = 0;
  }
  else {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RDI->parent->d_ptr);
    if (pQVar1->itemDepth == -1) {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RDI->parent->d_ptr);
      resolveDepth(in_RDI);
    }
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RDI->parent->d_ptr);
    in_RDI->itemDepth = pQVar1->itemDepth + 1;
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::resolveDepth()
{
    if (!parent)
        itemDepth = 0;
    else {
        if (parent->d_ptr->itemDepth == -1)
            parent->d_ptr->resolveDepth();
        itemDepth = parent->d_ptr->itemDepth + 1;
    }
}